

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell_renderer.cpp
# Opt level: O2

void __thiscall duckdb_shell::ModeJsonRenderer::Render(ModeJsonRenderer *this,RowResult *result)

{
  char cVar1;
  
  cVar1 = (this->super_RowRenderer).field_0x59;
  if ((this->super_RowRenderer).first_row == true) {
    if (cVar1 != '\0') {
      ShellState::Print((this->super_RowRenderer).super_ShellRenderer.state,"[");
    }
    ShellState::Print((this->super_RowRenderer).super_ShellRenderer.state,"{");
    (this->super_RowRenderer).first_row = false;
  }
  else {
    if (cVar1 != '\0') {
      ShellState::Print((this->super_RowRenderer).super_ShellRenderer.state,",");
    }
    ShellState::Print((this->super_RowRenderer).super_ShellRenderer.state,"\n{");
  }
  (*(this->super_RowRenderer).super_ShellRenderer._vptr_ShellRenderer[4])(this,result);
  return;
}

Assistant:

void Render(RowResult &result) override {
		if (first_row) {
			if (json_array) {
				// wrap all JSON objects in an array
				state.Print("[");
			}
			state.Print("{");
			first_row = false;
		} else {
			if (json_array) {
				// wrap all JSON objects in an array
				state.Print(",");
			}
			state.Print("\n{");
		}
		RenderRow(result);
	}